

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void disableCursor(_GLFWwindow *window)

{
  _GLFWwindow *window_local;
  
  if (window->rawMouseMotion != 0) {
    enableRawMouseMotion(window);
  }
  _glfw.x11.disabledCursorWindow = window;
  _glfwPlatformGetCursorPos(window,&_glfw.x11.restoreCursorPosX,&_glfw.x11.restoreCursorPosY);
  updateCursorImage(window);
  _glfwCenterCursorInContentArea(window);
  (*_glfw.x11.xlib.GrabPointer)
            (_glfw.x11.display,(window->x11).handle,1,0x4c,1,1,(window->x11).handle,
             _glfw.x11.hiddenCursorHandle,0);
  return;
}

Assistant:

static void disableCursor(_GLFWwindow* window)
{
    if (window->rawMouseMotion)
        enableRawMouseMotion(window);

    _glfw.x11.disabledCursorWindow = window;
    _glfwPlatformGetCursorPos(window,
                              &_glfw.x11.restoreCursorPosX,
                              &_glfw.x11.restoreCursorPosY);
    updateCursorImage(window);
    _glfwCenterCursorInContentArea(window);
    XGrabPointer(_glfw.x11.display, window->x11.handle, True,
                 ButtonPressMask | ButtonReleaseMask | PointerMotionMask,
                 GrabModeAsync, GrabModeAsync,
                 window->x11.handle,
                 _glfw.x11.hiddenCursorHandle,
                 CurrentTime);
}